

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::DoAddVar(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,double lb,double ub,Type type)

{
  Var VVar1;
  undefined4 in_ESI;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  NodeRange NVar2;
  NodeRange NVar3;
  int v;
  undefined8 local_40;
  undefined4 uVar4;
  Type type_00;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_fffffffffffffff0;
  
  uVar4 = (undefined4)in_XMM1_Qa;
  type_00 = (Type)((ulong)in_XMM1_Qa >> 0x20);
  GetModel(in_RDI);
  VVar1 = FlatModel<mp::DefaultFlatModelParams>::AddVar__basic
                    (in_stack_fffffffffffffff0,(double)in_RDI,in_XMM0_Qa,type_00);
  GetVarValueNode((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   *)0x47b00c);
  NVar2 = pre::ValueNode::Select
                    ((ValueNode *)CONCAT44(in_ESI,VVar1),(int)((ulong)local_40 >> 0x20),
                     (int)local_40);
  NVar3.pvn_._4_4_ = in_ESI;
  NVar3.pvn_._0_4_ = VVar1;
  NVar3.ir_.beg_ = uVar4;
  NVar3.ir_.end_ = type_00;
  NVar3 = AutoLink((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)NVar2.ir_,NVar3);
  return NVar3;
}

Assistant:

pre::NodeRange DoAddVar(double lb=MinusInfty(), double ub=Infty(),
             var::Type type = var::CONTINUOUS) {
    int v = GetModel().AddVar__basic(lb, ub, type);
    return AutoLink( GetVarValueNode().Select( v ) );
  }